

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

void __thiscall
VmaPool_T::VmaPool_T
          (VmaPool_T *this,VmaAllocator hAllocator,VmaPoolCreateInfo *createInfo,
          VkDeviceSize preferredBlockSize)

{
  uint uVar1;
  unsigned_long *puVar2;
  size_t in_RCX;
  long in_RDX;
  void *in_RSI;
  VkDeviceSize in_RDI;
  undefined1 uVar3;
  VmaAllocator_T *in_stack_ffffffffffffff30;
  uint32_t in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  undefined1 explicitBlockSize;
  uint32_t in_stack_ffffffffffffff5c;
  undefined7 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 uVar4;
  VmaAllocator local_88;
  VkDeviceSize bufferImageGranularity;
  uint32_t algorithm;
  size_t sVar5;
  VkDeviceSize local_40 [2];
  long local_30;
  
  if (*(long *)(in_RDX + 8) != 0) {
    in_RCX = *(size_t *)(in_RDX + 8);
  }
  bufferImageGranularity = *(VkDeviceSize *)(in_RDX + 0x10);
  sVar5 = in_RCX;
  local_30 = in_RDX;
  if ((*(uint *)(in_RDX + 4) & 2) == 0) {
    local_88 = (VmaAllocator)VmaAllocator_T::GetBufferImageGranularity(in_stack_ffffffffffffff30);
  }
  else {
    local_88 = (VmaAllocator)0x1;
  }
  algorithm = (uint32_t)sVar5;
  uVar3 = *(long *)(local_30 + 8) != 0;
  uVar1 = *(uint *)(local_30 + 4);
  uVar4 = *(undefined4 *)(local_30 + 0x20);
  local_40[0] = VmaAllocator_T::GetMemoryTypeMinAlignment
                          ((VmaAllocator_T *)
                           CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                           in_stack_ffffffffffffff3c);
  explicitBlockSize = (undefined1)((uint)in_stack_ffffffffffffff44 >> 0x18);
  puVar2 = std::max<unsigned_long>(local_40,(unsigned_long *)(local_30 + 0x28));
  VmaBlockVector::VmaBlockVector
            ((VmaBlockVector *)CONCAT44(uVar4,in_stack_ffffffffffffff70),local_88,
             (VmaPool)CONCAT17(uVar3,in_stack_ffffffffffffff60),in_stack_ffffffffffffff5c,
             *(VkDeviceSize *)(local_30 + 0x30),*puVar2,in_RCX,bufferImageGranularity,
             (bool)explicitBlockSize,algorithm,(float)(uVar1 & 4),in_RDI,in_RSI);
  VmaDedicatedAllocationList::VmaDedicatedAllocationList((VmaDedicatedAllocationList *)local_88);
  *(undefined4 *)(in_RDI + 0x110) = 0;
  *(undefined8 *)(in_RDI + 0x118) = 0;
  *(undefined8 *)(in_RDI + 0x120) = 0;
  *(undefined8 *)(in_RDI + 0x128) = 0;
  return;
}

Assistant:

VmaPool_T::VmaPool_T(
    VmaAllocator hAllocator,
    const VmaPoolCreateInfo& createInfo,
    VkDeviceSize preferredBlockSize)
    : m_BlockVector(
        hAllocator,
        this, // hParentPool
        createInfo.memoryTypeIndex,
        createInfo.blockSize != 0 ? createInfo.blockSize : preferredBlockSize,
        createInfo.minBlockCount,
        createInfo.maxBlockCount,
        (createInfo.flags& VMA_POOL_CREATE_IGNORE_BUFFER_IMAGE_GRANULARITY_BIT) != 0 ? 1 : hAllocator->GetBufferImageGranularity(),
        createInfo.blockSize != 0, // explicitBlockSize
        createInfo.flags & VMA_POOL_CREATE_ALGORITHM_MASK, // algorithm
        createInfo.priority,
        VMA_MAX(hAllocator->GetMemoryTypeMinAlignment(createInfo.memoryTypeIndex), createInfo.minAllocationAlignment),
        createInfo.pMemoryAllocateNext),
    m_Id(0),
    m_Name(VMA_NULL) {}